

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O0

void __thiscall blcl::net::connection<MsgType>::read_body(connection<MsgType> *this)

{
  uchar *data;
  size_t size_in_bytes;
  anon_class_8_1_8991fb9c_for_handler_ local_28;
  mutable_buffer local_20;
  connection<MsgType> *local_10;
  connection<MsgType> *this_local;
  
  local_10 = this;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   (&(this->current_incoming_message_).body);
  size_in_bytes = message<MsgType>::size(&this->current_incoming_message_);
  local_20 = (mutable_buffer)asio::buffer(data,size_in_bytes);
  local_28.this = this;
  asio::
  async_read<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Swung0x48[P]SimpleRealTimeNetworking_NetCommon_net_connection_h:119:17)>
            (&this->socket_,(mutable_buffers_1 *)&local_20,&local_28,0);
  return;
}

Assistant:

void read_body() {
            asio::async_read(socket_, asio::buffer(current_incoming_message_.body.data(), current_incoming_message_.size()),
                [this](std::error_code ec, std::size_t length) {
                    if (!ec) {
                        add_to_incoming_messages_queue();
                    } else {
                        std::cout << "[WARN] " << id_ << ": Read body failed.\n";
                        std::cout << "[WARN] " << id_ << ": " << ec.message() << "\n";
                        socket_.close();
                    }
            });
        }